

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O3

Vector * operator*(Vector *__return_storage_ptr__,Vector *l,double lambda)

{
  double *pdVar1;
  double *now;
  double *pdVar2;
  Vector *__range1;
  
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,l);
  pdVar1 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar2 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                _M_impl.super__Vector_impl_data._M_start; pdVar2 != pdVar1; pdVar2 = pdVar2 + 1) {
    *pdVar2 = *pdVar2 * lambda;
  }
  return __return_storage_ptr__;
}

Assistant:

Vector operator*(const Vector& l, double lambda)
{
	Vector r = l;
	for (auto& now : r)
	{
		now *= lambda;
	}
	return r;
}